

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamTaperedTimoshenko.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamTaperedTimoshenko::UpdateRotation(ChElementBeamTaperedTimoshenko *this)

{
  pointer psVar1;
  element_type *peVar2;
  element_type *peVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  bool bVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  double dVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  double dVar37;
  double dVar38;
  undefined1 auVar39 [16];
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  double dVar54;
  double dVar55;
  undefined1 auVar56 [16];
  double dVar60;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  double dVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  double dVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  double dVar85;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  ChMatrix33<double> Aabs;
  ChMatrix33<double> A0;
  double local_b8;
  double dStack_b0;
  double dStack_a8;
  double dStack_a0;
  double dStack_98;
  double dStack_90;
  double dStack_88;
  double dStack_80;
  double local_78;
  ChMatrix33<double> *local_68;
  double *local_60;
  ChMatrix33<double> local_58;
  
  ChMatrix33<double>::ChMatrix33(&local_58,&this->q_element_ref_rot);
  if (this->disable_corotate == true) {
    local_b8 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [0];
    dStack_b0 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
    dStack_a8 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [2];
    dStack_a0 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
    dStack_98 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
    dStack_90 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [5];
    dStack_88 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    dStack_80 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
    local_78 = local_58.super_Matrix<double,_3,_3,_1,_3,_3>.
               super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
               [8];
    dVar30 = (this->q_element_ref_rot).m_data[1];
    (this->q_element_abs_rot).m_data[0] = (this->q_element_ref_rot).m_data[0];
    (this->q_element_abs_rot).m_data[1] = dVar30;
    (this->q_element_abs_rot).m_data[2] = (this->q_element_ref_rot).m_data[2];
    dVar60 = (this->q_element_ref_rot).m_data[3];
    goto LAB_00669a56;
  }
  auVar22 = *(undefined1 (*) [16])((this->q_refrotA).m_data + 3);
  auVar21 = *(undefined1 (*) [16])(this->q_refrotA).m_data;
  dVar30 = (this->q_refrotA).m_data[1];
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar30;
  dVar54 = (this->q_refrotB).m_data[1];
  auVar44._8_8_ = 0;
  auVar44._0_8_ = dVar54;
  psVar1 = (this->nodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzrot>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  auVar20 = vmovhpd_avx(*(undefined1 (*) [16])((this->q_refrotA).m_data + 2),
                        (this->q_refrotB).m_data[2]);
  peVar2 = (psVar1->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  peVar3 = psVar1[1].super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  auVar92._8_8_ = 0;
  auVar92._0_8_ = (this->q_refrotB).m_data[3];
  auVar10 = vunpcklpd_avx512vl(auVar21,auVar92);
  dVar60 = auVar22._8_8_;
  auVar19._0_8_ = auVar21._0_8_;
  auVar19._8_8_ = dVar60;
  auVar21._8_8_ = 0x8000000000000000;
  auVar21._0_8_ = 0x8000000000000000;
  auVar11 = vxorpd_avx512vl(auVar19,auVar21);
  auVar12 = vunpcklpd_avx512vl(auVar33,auVar44);
  auVar88._0_8_ = auVar22._0_8_ * auVar22._0_8_;
  auVar88._8_8_ = dVar60 * dVar60;
  auVar13 = vunpcklpd_avx512vl(auVar22,auVar92);
  auVar39._8_8_ = 0x4000000000000000;
  auVar39._0_8_ = 0x4000000000000000;
  auVar14 = vmulpd_avx512vl(auVar12,auVar20);
  auVar15 = vmulpd_avx512vl(auVar10,auVar10);
  auVar41._0_8_ = auVar20._0_8_ * auVar20._0_8_;
  auVar41._8_8_ = auVar20._8_8_ * auVar20._8_8_;
  auVar16 = vmulpd_avx512vl(auVar20,auVar13);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)&peVar2->field_0x40;
  auVar86._8_8_ = 0;
  auVar86._0_8_ = *(ulong *)&peVar2->field_0x48;
  auVar72._8_8_ = 0;
  auVar72._0_8_ = *(ulong *)&peVar3->field_0x50;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)&peVar2->field_0x38;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)&peVar2->field_0x50;
  auVar22 = vmovhpd_avx(auVar86,*(undefined8 *)&peVar3->field_0x48);
  auVar21 = vmovhpd_avx(auVar82,*(undefined8 *)&peVar3->field_0x40);
  auVar61._8_8_ = 0;
  auVar61._0_8_ = dVar54 * dVar54;
  auVar10 = vunpcklpd_avx512vl(auVar15,auVar61);
  auVar56._0_8_ = auVar10._0_8_ + dVar30 * dVar30;
  auVar56._8_8_ = auVar10._8_8_ + auVar88._8_8_;
  auVar17 = vmulpd_avx512vl(auVar13,auVar11);
  auVar18 = vmulpd_avx512vl(auVar20,auVar11);
  auVar13 = vmulpd_avx512vl(auVar12,auVar13);
  auVar19 = vmulpd_avx512vl(auVar12,auVar11);
  auVar10 = vunpcklpd_avx(auVar76,auVar72);
  auVar11 = vunpcklpd_avx(auVar51,auVar72);
  auVar20 = vaddpd_avx512vl(auVar14,auVar17);
  auVar12 = vsubpd_avx512vl(auVar14,auVar17);
  auVar17 = vmulpd_avx512vl(auVar21,auVar11);
  dVar30 = auVar10._0_8_ * auVar10._0_8_;
  auVar45._0_8_ = auVar20._0_8_ + auVar20._0_8_;
  auVar45._8_8_ = auVar20._8_8_ + auVar20._8_8_;
  auVar14._0_8_ = auVar15._0_8_;
  auVar14._8_8_ = auVar88._8_8_;
  auVar62._0_8_ = auVar12._0_8_ + auVar12._0_8_;
  auVar62._8_8_ = auVar12._8_8_ + auVar12._8_8_;
  auVar12 = vaddpd_avx512vl(auVar14,auVar41);
  auVar42._8_8_ = 0xbff0000000000000;
  auVar42._0_8_ = 0xbff0000000000000;
  auVar33 = ZEXT816(0) << 0x40;
  auVar20 = vfmadd213pd_fma(auVar56,auVar39,auVar42);
  auVar14 = vfmadd213pd_avx512vl(auVar12,auVar39,auVar42);
  auVar12 = vfmadd231pd_fma(auVar62,auVar33,auVar20);
  dVar54 = auVar18._0_8_ + auVar13._0_8_;
  dVar60 = auVar18._8_8_ + auVar13._8_8_;
  auVar20 = vsubpd_avx(auVar13,auVar18);
  auVar13 = vaddpd_avx512vl(auVar19,auVar16);
  auVar14 = vfmadd231pd_avx512vl(auVar14,auVar33,auVar45);
  auVar16 = vsubpd_avx512vl(auVar16,auVar19);
  auVar57._0_8_ = dVar54 + dVar54;
  auVar57._8_8_ = dVar60 + dVar60;
  auVar87._0_8_ = auVar20._0_8_ + auVar20._0_8_;
  auVar87._8_8_ = auVar20._8_8_ + auVar20._8_8_;
  auVar90._0_8_ = auVar13._0_8_ + auVar13._0_8_;
  auVar90._8_8_ = auVar13._8_8_ + auVar13._8_8_;
  auVar46._0_8_ = auVar16._0_8_ + auVar16._0_8_;
  auVar46._8_8_ = auVar16._8_8_ + auVar16._8_8_;
  auVar13 = vfmadd213pd_fma(auVar57,auVar33,auVar12);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = *(ulong *)&peVar3->field_0x38;
  auVar12 = vfmadd231pd_fma(auVar90,auVar33,auVar87);
  auVar20 = vaddpd_avx512vl(auVar88,auVar15);
  auVar15 = vfmadd213pd_avx512vl(auVar46,auVar33,auVar14);
  auVar20 = vfmadd213pd_fma(auVar20,auVar39,auVar42);
  auVar14 = vfmadd213pd_fma(auVar20,auVar33,auVar12);
  dVar55 = auVar22._0_8_;
  auVar91._0_8_ = dVar55 * auVar11._0_8_;
  dVar71 = auVar22._8_8_;
  auVar91._8_8_ = dVar71 * auVar11._8_8_;
  auVar20 = vunpcklpd_avx(auVar76,auVar63);
  auVar12 = vunpcklpd_avx(auVar51,auVar63);
  auVar64._0_8_ = auVar20._0_8_ * auVar11._0_8_;
  auVar64._8_8_ = auVar20._8_8_ * auVar11._8_8_;
  dVar60 = auVar21._0_8_;
  auVar73._0_8_ = dVar60 * dVar55;
  dVar37 = auVar21._8_8_;
  auVar73._8_8_ = dVar37 * dVar71;
  dVar54 = auVar12._8_8_ * auVar12._8_8_;
  auVar16 = vmulpd_avx512vl(auVar20,auVar22);
  auVar89._0_8_ = auVar20._0_8_ * dVar60;
  auVar89._8_8_ = auVar20._8_8_ * dVar37;
  auVar77._0_8_ = dVar60 * dVar60;
  auVar77._8_8_ = dVar37 * dVar37;
  auVar22 = vsubpd_avx(auVar73,auVar64);
  auVar11._8_8_ = dVar54;
  auVar11._0_8_ = dVar30;
  auVar18._0_8_ = auVar12._0_8_ * auVar12._0_8_ + dVar30;
  auVar18._8_8_ = dVar54 + auVar10._8_8_ * auVar10._8_8_;
  auVar21 = vaddpd_avx512vl(auVar11,auVar77);
  auVar65._0_8_ = auVar73._0_8_ + auVar64._0_8_ + auVar73._0_8_ + auVar64._0_8_;
  auVar65._8_8_ = auVar73._8_8_ + auVar64._8_8_ + auVar73._8_8_ + auVar64._8_8_;
  auVar20 = vfmadd213pd_fma(auVar18,auVar39,auVar42);
  auVar21 = vfmadd213pd_fma(auVar21,auVar39,auVar42);
  dVar30 = auVar15._0_8_;
  auVar83._0_8_ = (auVar22._0_8_ + auVar22._0_8_) * dVar30;
  dVar54 = auVar15._8_8_;
  auVar83._8_8_ = (auVar22._8_8_ + auVar22._8_8_) * dVar54;
  auVar22 = vfmadd231pd_fma(auVar83,auVar13,auVar21);
  auVar21 = vaddpd_avx512vl(auVar16,auVar17);
  auVar78._0_8_ = auVar21._0_8_ + auVar21._0_8_;
  auVar78._8_8_ = auVar21._8_8_ + auVar21._8_8_;
  auVar10 = vfmadd213pd_fma(auVar78,auVar14,auVar22);
  auVar84._0_8_ = dVar55 * dVar55;
  auVar84._8_8_ = dVar71 * dVar71;
  auVar22 = vaddpd_avx512vl(auVar11,auVar84);
  auVar22 = vfmadd213pd_fma(auVar22,auVar39,auVar42);
  auVar74._0_8_ = auVar22._0_8_ * dVar30;
  auVar74._8_8_ = auVar22._8_8_ * dVar54;
  auVar47._0_8_ = (auVar89._0_8_ + auVar91._0_8_ + auVar89._0_8_ + auVar91._0_8_) * dVar30;
  auVar47._8_8_ = (auVar89._8_8_ + auVar91._8_8_ + auVar89._8_8_ + auVar91._8_8_) * dVar54;
  auVar21 = vsubpd_avx(*(undefined1 (*) [16])&peVar3->field_0x28,
                       *(undefined1 (*) [16])&peVar2->field_0x28);
  auVar11 = vfmadd231pd_fma(auVar74,auVar13,auVar65);
  auVar22 = vsubpd_avx(auVar91,auVar89);
  auVar66._0_8_ = auVar22._0_8_ + auVar22._0_8_;
  auVar66._8_8_ = auVar22._8_8_ + auVar22._8_8_;
  auVar22 = vfmadd213pd_fma(auVar66,auVar14,auVar11);
  auVar11 = vsubpd_avx512vl(auVar17,auVar16);
  auVar75._0_8_ = auVar11._0_8_ + auVar11._0_8_;
  auVar75._8_8_ = auVar11._8_8_ + auVar11._8_8_;
  auVar11 = vfmadd231pd_fma(auVar47,auVar13,auVar75);
  dVar55 = auVar22._0_8_ + auVar22._8_8_;
  dVar30 = *(double *)((long)&peVar3->super_ChNodeFEAbase + 0x20) -
           *(double *)((long)&peVar2->super_ChNodeFEAbase + 0x20);
  auVar22 = vfmadd213pd_fma(auVar20,auVar14,auVar11);
  auVar48._0_8_ = auVar10._0_8_ + auVar10._8_8_;
  auVar48._8_8_ = auVar10._0_8_ + auVar10._8_8_;
  auVar10 = ZEXT816(0) << 0x40;
  auVar16._0_8_ = auVar22._0_8_ + auVar22._8_8_;
  auVar16._8_8_ = auVar22._0_8_ + auVar22._8_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar55 * dVar55;
  auVar22 = vfmadd231sd_fma(auVar15,auVar48,auVar48);
  auVar22 = vfmadd231sd_fma(auVar22,auVar16,auVar16);
  auVar22 = vsqrtsd_avx(auVar22,auVar22);
  auVar20 = ZEXT816(0x3ff0000000000000);
  dVar37 = auVar22._0_8_;
  dVar71 = 1.0 / dVar37;
  bVar9 = 2.2250738585072014e-308 <= dVar37;
  auVar52._8_8_ = 0;
  auVar52._0_8_ = dVar71 * auVar48._0_8_;
  auVar22._0_8_ =
       (double)((ulong)bVar9 * (long)(dVar71 * auVar48._0_8_) + (ulong)!bVar9 * 0x3ff0000000000000);
  auVar22._8_8_ = 0;
  dVar54 = (double)((ulong)bVar9 * (long)(dVar71 * dVar55));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar54;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar71 * auVar16._0_8_;
  dVar60 = (double)((ulong)bVar9 * (long)(dVar71 * auVar16._0_8_));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar60;
  if ((dVar30 != 0.0) || (NAN(dVar30))) {
LAB_006695ef:
    dVar81 = auVar21._0_8_;
    auVar21 = vshufpd_avx(auVar21,auVar21,1);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar81 * dVar81;
    auVar67._8_8_ = 0;
    auVar67._0_8_ = dVar30;
    auVar20 = vfmadd231sd_fma(auVar25,auVar67,auVar67);
    auVar20 = vfmadd231sd_fma(auVar20,auVar21,auVar21);
    auVar20 = vsqrtsd_avx(auVar20,auVar20);
    dVar85 = 1.0 / auVar20._0_8_;
    bVar9 = 2.2250738585072014e-308 <= auVar20._0_8_;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = (ulong)bVar9 * (long)(dVar85 * auVar21._0_8_);
    auVar10._8_8_ = 0;
    auVar10._0_8_ = (ulong)bVar9 * (long)(dVar81 * dVar85);
    auVar20._0_8_ = (ulong)bVar9 * (long)(dVar30 * dVar85) + (ulong)!bVar9 * 0x3ff0000000000000;
    auVar20._8_8_ = 0;
  }
  else {
    uVar4 = vcmppd_avx512vl(auVar21,auVar33,0);
    if (((uVar4 & 1) == 0) || (auVar23 = ZEXT816(0) << 0x40, (uVar4 & 3) >> 1 == 0))
    goto LAB_006695ef;
  }
  dVar81 = auVar10._0_8_;
  dVar85 = auVar23._0_8_;
  auVar68._8_8_ = 0;
  auVar68._0_8_ = dVar54 * dVar85;
  auVar21 = vfmsub231sd_fma(auVar68,auVar10,auVar13);
  dVar30 = auVar21._0_8_;
  local_b8 = auVar20._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = dVar81 * auVar22._0_8_;
  auVar11 = vfmsub231sd_fma(auVar34,auVar20,auVar12);
  local_78 = auVar11._0_8_;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dVar60 * local_b8;
  auVar22 = vfmsub231sd_fma(auVar79,auVar23,auVar22);
  dVar54 = auVar22._0_8_;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = dVar54 * dVar54;
  auVar22 = vfmadd231sd_fma(auVar58,auVar21,auVar21);
  auVar22 = vfmadd231sd_fma(auVar22,auVar11,auVar11);
  auVar22 = vsqrtsd_avx(auVar22,auVar22);
  dVar60 = auVar22._0_8_;
  if (dVar60 < 0.0001) {
    if ((dVar37 < 2.2250738585072014e-308) ||
       (auVar6._8_8_ = 0x7fffffffffffffff, auVar6._0_8_ = 0x7fffffffffffffff,
       auVar22 = vandpd_avx512vl(auVar52,auVar6), 0.9 <= auVar22._0_8_)) {
      auVar22 = ZEXT816(0x3ff0000000000000);
      auVar43 = ZEXT816(0);
      if (dVar37 < 2.2250738585072014e-308) {
        auVar21 = ZEXT816(0);
      }
      else {
        auVar7._8_8_ = 0x7fffffffffffffff;
        auVar7._0_8_ = 0x7fffffffffffffff;
        auVar49._8_8_ = 0;
        auVar49._0_8_ = dVar71 * dVar55;
        auVar11 = vandpd_avx512vl(auVar49,auVar7);
        auVar21 = ZEXT816(0) << 0x40;
        if (0.9 <= auVar11._0_8_) {
          auVar8._8_8_ = 0x7fffffffffffffff;
          auVar8._0_8_ = 0x7fffffffffffffff;
          auVar11 = vandpd_avx512vl(auVar17,auVar8);
          auVar22 = ZEXT816(0);
          uVar5 = vcmpsd_avx512f(auVar11,ZEXT816(0x3feccccccccccccd),5);
          auVar43._8_8_ = 0;
          auVar43._0_8_ = (ulong)!(bool)((byte)uVar5 & 1) * 0x3ff0000000000000;
        }
      }
    }
    else {
      auVar21 = ZEXT816(0x3ff0000000000000);
      auVar43 = ZEXT816(0);
      auVar22 = ZEXT816(0) << 0x40;
    }
    auVar80._8_8_ = 0;
    auVar80._0_8_ = auVar43._0_8_ * -local_b8;
    auVar11 = vfmadd231sd_fma(auVar80,auVar23,auVar21);
    auVar69._8_8_ = 0;
    auVar69._0_8_ = -dVar85 * auVar22._0_8_;
    auVar12 = vfmadd231sd_fma(auVar69,auVar10,auVar43);
    dVar30 = auVar12._0_8_;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = auVar21._0_8_ * -dVar81;
    auVar22 = vfmadd231sd_fma(auVar35,auVar20,auVar22);
    local_78 = auVar22._0_8_;
    dVar54 = auVar11._0_8_;
    auVar31._8_8_ = 0;
    auVar31._0_8_ = dVar54 * dVar54;
    auVar21 = vfmadd231sd_fma(auVar31,auVar12,auVar12);
    auVar22 = vfmadd231sd_fma(auVar21,auVar22,auVar22);
    auVar22 = vsqrtsd_avx(auVar22,auVar22);
    dVar60 = auVar22._0_8_;
  }
  dVar60 = 1.0 / dVar60;
  dVar30 = dVar30 * dVar60;
  dVar54 = dVar54 * dVar60;
  local_78 = local_78 * dVar60;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = local_78;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = dVar85 * dVar30;
  auVar22 = vfmsub231sd_fma(auVar36,auVar32,auVar20);
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar81 * local_78;
  auVar59._8_8_ = 0;
  auVar59._0_8_ = dVar54;
  auVar21 = vfmsub231sd_fma(auVar53,auVar59,auVar23);
  dVar37 = auVar21._0_8_;
  auVar50._8_8_ = 0;
  auVar50._0_8_ = dVar30;
  auVar70._8_8_ = 0;
  auVar70._0_8_ = local_b8 * dVar54;
  auVar21 = vfmsub231sd_fma(auVar70,auVar50,auVar10);
  dVar55 = auVar21._0_8_;
  dStack_98 = auVar22._0_8_;
  dVar60 = local_78 + local_b8 + dStack_98;
  dStack_b0 = dVar37;
  dStack_a8 = dVar30;
  dStack_a0 = dVar81;
  dStack_90 = dVar54;
  dStack_88 = dVar85;
  dStack_80 = dVar55;
  if (0.0 <= dVar60) {
    dVar60 = dVar60 + 1.0;
    if (dVar60 < 0.0) {
      dVar60 = sqrt(dVar60);
    }
    else {
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar60;
      auVar22 = vsqrtsd_avx(auVar27,auVar27);
      dVar60 = auVar22._0_8_;
    }
    dVar40 = dVar60 * 0.5;
    dVar60 = 0.5 / dVar60;
    dVar71 = (dVar55 - dVar54) * dVar60;
    dVar38 = (dVar30 - dVar85) * dVar60;
    dVar60 = (dVar81 - dVar37) * dVar60;
  }
  else {
    if (dStack_98 <= local_b8) {
      if (local_b8 < local_78) goto LAB_0066981e;
      dVar60 = ((local_b8 - dStack_98) - local_78) + 1.0;
      if (dVar60 < 0.0) {
        dVar24 = sqrt(dVar60);
      }
      else {
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar60;
        auVar22 = vsqrtsd_avx(auVar29,auVar29);
        dVar24 = auVar22._0_8_;
      }
      dVar40 = dVar55 - dVar54;
      dVar71 = dVar24 * 0.5;
      dVar24 = 0.5 / dVar24;
      dVar38 = (dVar81 + dVar37) * dVar24;
      dVar60 = (dVar85 + dVar30) * dVar24;
    }
    else if (dStack_98 < local_78) {
LAB_0066981e:
      dVar60 = ((local_78 - local_b8) - dStack_98) + 1.0;
      if (dVar60 < 0.0) {
        dVar24 = sqrt(dVar60);
      }
      else {
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar60;
        auVar22 = vsqrtsd_avx(auVar28,auVar28);
        dVar24 = auVar22._0_8_;
      }
      dVar40 = dVar81 - dVar37;
      dVar60 = dVar24 * 0.5;
      dVar24 = 0.5 / dVar24;
      dVar71 = (dVar85 + dVar30) * dVar24;
      dVar38 = (dVar55 + dVar54) * dVar24;
    }
    else {
      dVar60 = ((dStack_98 - local_78) - local_b8) + 1.0;
      if (dVar60 < 0.0) {
        dVar24 = sqrt(dVar60);
      }
      else {
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dVar60;
        auVar22 = vsqrtsd_avx(auVar26,auVar26);
        dVar24 = auVar22._0_8_;
      }
      dVar40 = dVar30 - dVar85;
      dVar38 = dVar24 * 0.5;
      dVar24 = 0.5 / dVar24;
      dVar60 = (dVar55 + dVar54) * dVar24;
      dVar71 = (dVar81 + dVar37) * dVar24;
    }
    dVar40 = dVar40 * dVar24;
  }
  (this->q_element_abs_rot).m_data[0] = dVar40;
  (this->q_element_abs_rot).m_data[1] = dVar71;
  (this->q_element_abs_rot).m_data[2] = dVar38;
LAB_00669a56:
  (this->q_element_abs_rot).m_data[3] = dVar60;
  local_60 = &local_b8;
  local_68 = &local_58;
  ChMatrix33<double>::operator=
            (&(this->super_ChElementCorotational).A,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_68);
  return;
}

Assistant:

void ChElementBeamTaperedTimoshenko::UpdateRotation() {
    ChMatrix33<> A0(this->q_element_ref_rot);

    ChMatrix33<> Aabs;
    if (this->disable_corotate) {
        Aabs = A0;
        q_element_abs_rot = q_element_ref_rot;
    } else {
        ChVector<> mXele_w = nodes[1]->Frame().GetPos() - nodes[0]->Frame().GetPos();
        // propose Y_w as absolute dir of the Y axis of A node, removing the effect of Aref-to-A rotation if any:
        //    Y_w = [R Aref->w ]*[R Aref->A ]'*{0,1,0}
        ChVector<> myele_wA = nodes[0]->Frame().GetRot().Rotate(q_refrotA.RotateBack(ChVector<>(0, 1, 0)));
        // propose Y_w as absolute dir of the Y axis of B node, removing the effect of Bref-to-B rotation if any:
        //    Y_w = [R Bref->w ]*[R Bref->B ]'*{0,1,0}
        ChVector<> myele_wB = nodes[1]->Frame().GetRot().Rotate(q_refrotB.RotateBack(ChVector<>(0, 1, 0)));
        // Average the two Y directions to have midpoint torsion (ex -30?torsion A and +30?torsion B= 0?
        ChVector<> myele_w = (myele_wA + myele_wB).GetNormalized();
        Aabs.Set_A_Xdir(mXele_w, myele_w);
        q_element_abs_rot = Aabs.Get_A_quaternion();
    }

    this->A = A0.transpose() * Aabs;
}